

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

void register_subpage(uc_struct_conflict15 *uc,FlatView *fv,MemoryRegionSection *section)

{
  uint uVar1;
  AddressSpaceDispatch *d;
  undefined1 a [16];
  uint16_t uVar2;
  MemoryRegionSection *pMVar3;
  MemoryRegion *mr;
  MemoryRegionSection *section_00;
  MemoryRegionSection *section_01;
  ulong uVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  d = (AddressSpaceDispatch *)(uc->address_space_memory).current_map;
  uVar5 = (uint)*(undefined8 *)(fv + 1);
  pMVar3 = phys_page_find(d,(hwaddr)(ulong)(uVar5 & 0xffffc000));
  uVar6._0_4_ = 0x4000;
  uVar6._4_4_ = 0;
  uVar7._0_4_ = 0;
  uVar7._4_4_ = 0;
  mr = pMVar3->mr;
  if (mr->subpage == false) {
    if (mr != (MemoryRegion *)(*(long *)(*(long *)&fv->nr + 0x80) + 0x1d0)) {
      __assert_fail("existing->mr->subpage || existing->mr == &(section->mr->uc->io_mem_unassigned)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x372,
                    "void register_subpage(struct uc_struct *, FlatView *, MemoryRegionSection *)");
    }
    mr = (MemoryRegion *)g_malloc0(0x80b0);
    *(uc_struct_conflict15 **)(mr + 1) = uc;
    mr[1].ram_block = (RAMBlock *)(ulong)(uVar5 & 0xffffc000);
    memory_region_init_io_tricore
              ((uc_struct_conflict15 *)
               (uc->address_space_memory).listeners.tqh_first[1].link.tqe_next,
               (MemoryRegion_conflict *)mr,&subpage_ops,mr,0x4000);
    mr->subpage = true;
    uVar2 = phys_section_add((uc_struct_conflict15 *)&d->map,(PhysPageMap *)&stack0xffffffffffffff88
                             ,section_00);
    phys_page_set(d,(ulong)(uVar5 >> 0xe),1,uVar2);
    uVar5 = (uint)*(undefined8 *)(fv + 1);
  }
  uVar4 = (ulong)(uVar5 & 0x3fff);
  uVar1 = fv->ref;
  a._8_4_ = (uint)uVar7;
  a._12_4_ = SUB84(uVar7,4);
  a._0_4_ = (uint)uVar6;
  a._4_4_ = SUB84(uVar6,4);
  int128_get64((Int128)a);
  uVar5 = (uVar1 + (uVar5 & 0x3fff)) - 1;
  uVar2 = phys_section_add((uc_struct_conflict15 *)&d->map,(PhysPageMap *)fv,section_01);
  if (uVar5 < 0x4000) {
    for (; uVar4 <= uVar5; uVar4 = uVar4 + 1) {
      *(uint16_t *)((long)&mr[1].ops + uVar4 * 2) = uVar2;
    }
  }
  return;
}

Assistant:

static void register_subpage(struct uc_struct *uc, FlatView *fv, MemoryRegionSection *section)
{
    AddressSpaceDispatch *d = flatview_to_dispatch(fv);
    subpage_t *subpage;
    hwaddr base = section->offset_within_address_space
        & TARGET_PAGE_MASK;
    MemoryRegionSection *existing = phys_page_find(d, base);
    MemoryRegionSection subsection = {
        .offset_within_address_space = base,
        .size = int128_make64(TARGET_PAGE_SIZE),
    };
    hwaddr start, end;

    assert(existing->mr->subpage || existing->mr == &(section->mr->uc->io_mem_unassigned));

    if (!(existing->mr->subpage)) {
        subpage = subpage_init(uc, fv, base);
        subsection.fv = fv;
        subsection.mr = &subpage->iomem;
        phys_page_set(d, base >> TARGET_PAGE_BITS, 1,
                      phys_section_add(uc, &d->map, &subsection));
    } else {
        subpage = container_of(existing->mr, subpage_t, iomem);
    }
    start = section->offset_within_address_space & ~TARGET_PAGE_MASK;
    end = start + int128_get64(section->size) - 1;
    subpage_register(uc, subpage, start, end,
                     phys_section_add(uc, &d->map, section));
}